

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ServerService.cpp
# Opt level: O2

void __thiscall
ServerService::startBroadcast(ServerService *this,sockaddr_in *peerAddr,char *msg,int sleepSecond)

{
  ssize_t sVar1;
  ostream *poVar2;
  char *pcVar3;
  
  sVar1 = sendto(this->broadcastFD,msg,8,0,(sockaddr *)peerAddr,0x10);
  pcVar3 = "Send Broadcast Success";
  if (sVar1 == -1) {
    pcVar3 = "Send Broadcast Error";
  }
  poVar2 = std::operator<<((ostream *)&std::cout,pcVar3);
  std::endl<char,std::char_traits<char>>(poVar2);
  sleep(sleepSecond);
  return;
}

Assistant:

void ServerService::startBroadcast(struct sockaddr_in *peerAddr, char* msg, int sleepSecond) {
    //    char msg[100] = "Msg from udp broadcast client!";
    if (-1 != sendto(broadcastFD, msg, sizeof(msg), 0, (struct sockaddr *) peerAddr, sizeof(struct sockaddr_in))) {
        cout << "Send Broadcast Success" << endl;
    } else {
        cout << "Send Broadcast Error" << endl;
    }
    sleep(sleepSecond);
}